

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_auth.cc
# Opt level: O0

bool __thiscall
prometheus::BasicAuthHandler::AuthorizeInner
          (BasicAuthHandler *this,CivetServer *param_1,mg_connection *conn)

{
  int iVar1;
  char *pcVar2;
  string *psVar3;
  long lVar4;
  undefined1 local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> password;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> username;
  size_type splitPos;
  string local_d0 [8];
  string decoded;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> b64Auth;
  string local_88 [8];
  string prefix;
  allocator local_51;
  string local_50 [8];
  string authHeaderStr;
  char *authHeader;
  mg_connection *conn_local;
  CivetServer *param_1_local;
  BasicAuthHandler *this_local;
  
  pcVar2 = mg_get_header(conn,"Authorization");
  if (pcVar2 == (char *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    authHeaderStr.field_2._8_8_ = pcVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,pcVar2,&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_88,"Basic ",(allocator *)(b64Auth.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(b64Auth.field_2._M_local_buf + 0xf));
    psVar3 = (string *)std::__cxx11::string::size();
    iVar1 = std::__cxx11::string::compare((ulong)local_50,0,psVar3);
    if (iVar1 == 0) {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)((long)&decoded.field_2 + 8),(ulong)local_50);
      std::__cxx11::string::string(local_d0);
      detail::base64_decode((string *)&splitPos,(string *)((long)&decoded.field_2 + 8));
      std::__cxx11::string::operator=(local_d0,(string *)&splitPos);
      std::__cxx11::string::~string((string *)&splitPos);
      lVar4 = std::__cxx11::string::find((char)local_d0,0x3a);
      if (lVar4 == -1) {
        this_local._7_1_ = false;
        b64Auth.field_2._8_4_ = 1;
      }
      else {
        std::__cxx11::string::substr((ulong)((long)&password.field_2 + 8),(ulong)local_d0);
        std::__cxx11::string::substr((ulong)local_138,(ulong)local_d0);
        this_local._7_1_ =
             std::
             function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::operator()(&this->callback_,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&password.field_2 + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_138);
        b64Auth.field_2._8_4_ = 1;
        std::__cxx11::string::~string((string *)local_138);
        std::__cxx11::string::~string((string *)(password.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string((string *)(decoded.field_2._M_local_buf + 8));
    }
    else {
      this_local._7_1_ = false;
      b64Auth.field_2._8_4_ = 1;
    }
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_50);
  }
  return this_local._7_1_;
}

Assistant:

bool BasicAuthHandler::AuthorizeInner(CivetServer*, mg_connection* conn) {
  const char* authHeader = mg_get_header(conn, "Authorization");

  if (authHeader == nullptr) {
    // No auth header was provided.
    return false;
  }
  std::string authHeaderStr = authHeader;

  // Basic auth header is expected to be of the form:
  // "Basic dXNlcm5hbWU6cGFzc3dvcmQ="

  const std::string prefix = "Basic ";
  if (authHeaderStr.compare(0, prefix.size(), prefix) != 0) {
    return false;
  }

  // Strip the "Basic " prefix leaving the base64 encoded auth string
  auto b64Auth = authHeaderStr.substr(prefix.size());

  std::string decoded;
  try {
    decoded = detail::base64_decode(b64Auth);
  } catch (...) {
    return false;
  }

  // decoded auth string is expected to be of the form:
  // "username:password"
  // colons may not appear in the username.
  auto splitPos = decoded.find(':');
  if (splitPos == std::string::npos) {
    return false;
  }

  auto username = decoded.substr(0, splitPos);
  auto password = decoded.substr(splitPos + 1);

  // TODO: bool does not permit a distinction between 401 Unauthorized
  //  and 403 Forbidden. Authentication may succeed, but the user still
  //  not be authorized to perform the request.
  return callback_(username, password);
}